

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint32_t farmhash32_mk_len_5_to_12(char *s,size_t len,uint32_t seed)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  
  uVar3 = (uint)len;
  iVar1 = *(int *)(s + (ulong)(uVar3 >> 3 & 1) * 4);
  iVar2 = *(int *)(s + (len - 4));
  uVar4 = mur(*(int *)s + uVar3,uVar3 * 5 + seed);
  uVar4 = mur(uVar3 * 5 + iVar2,uVar4);
  uVar4 = mur(iVar1 + 9,uVar4);
  uVar4 = fmix(seed ^ uVar4);
  return uVar4;
}

Assistant:

static inline uint32_t farmhash32_mk_len_5_to_12(const char *s, size_t len, uint32_t seed) {
  uint32_t a = len, b = len * 5, c = 9, d = b + seed;
  a += fetch32(s);
  b += fetch32(s + len - 4);
  c += fetch32(s + ((len >> 1) & 4));
  return fmix(seed ^ mur(c, mur(b, mur(a, d))));
}